

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

void __thiscall
de::Random::choose<char_const*,char*>(Random *this,char *first,char *last,char *result,int numItems)

{
  int max;
  long lVar1;
  
  for (lVar1 = 0; first + lVar1 != last; lVar1 = lVar1 + 1) {
    max = (int)lVar1;
    if ((max < numItems) || (max = getInt(this,0,max), max < numItems)) {
      result[max] = first[lVar1];
    }
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}